

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSum.h
# Opt level: O0

void __thiscall NaPNSum::~NaPNSum(NaPNSum *this)

{
  NaPetriCnOutput *in_RDI;
  
  (in_RDI->super_NaPetriConnector)._vptr_NaPetriConnector = (_func_int **)&PTR__NaPNSum_00195a08;
  NaVector::~NaVector((NaVector *)in_RDI);
  NaVector::~NaVector((NaVector *)in_RDI);
  NaPetriCnOutput::~NaPetriCnOutput(in_RDI);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)0x153190);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)0x15319e);
  NaPetriNode::~NaPetriNode(&this->super_NaPetriNode);
  return;
}

Assistant:

class PNNA_API NaPNSum : public NaPetriNode
{
public:

    // Create node for Petri network
    NaPNSum (const char* szNodeName = "sum");


    ////////////////
    // Connectors //
    ////////////////

    // Input (mainstream)
    NaPetriCnInput      main;

    // Another input
    NaPetriCnInput      aux;

    // Output (mainstream)
    NaPetriCnOutput     sum;


    ///////////////////
    // Quick linkage //
    ///////////////////

    // Return mainstream input connector (the only input or NULL)
    virtual NaPetriConnector*   main_input_cn ();


    ///////////////////
    // Node specific //
    ///////////////////

    // Assign gain weights on input; ones by default
    virtual void        set_gain (const NaVector& vMainK,
				  const NaVector& vAuxK);


    ///////////////////////
    // Phases of network //
    ///////////////////////

    // 2. Link connectors inside the node
    virtual void        relate_connectors ();

    // 5. Verification to be sure all is OK (true)
    virtual bool        verify ();

    // 8. True action of the node (if activate returned true)
    virtual void        action ();

protected:/* data */

    // Gain for main and auxiliary inputs
    NaVector		vMainGain, vAuxGain;

}